

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O2

void __thiscall
sglr::ReferenceContext::setTex2DArrayBinding
          (ReferenceContext *this,int unitNdx,Texture2DArray *texture)

{
  int *piVar1;
  pointer pTVar2;
  
  pTVar2 = (this->m_textureUnits).
           super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2[unitNdx].tex2DArrayBinding != (Texture2DArray *)0x0) {
    rc::ObjectManager<sglr::rc::Texture>::releaseReference
              (&this->m_textures,&(pTVar2[unitNdx].tex2DArrayBinding)->super_Texture);
    pTVar2 = (this->m_textureUnits).
             super__Vector_base<sglr::ReferenceContext::TextureUnit,_std::allocator<sglr::ReferenceContext::TextureUnit>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar2[unitNdx].tex2DArrayBinding = (Texture2DArray *)0x0;
  }
  if (texture != (Texture2DArray *)0x0) {
    piVar1 = &(texture->super_Texture).super_NamedObject.m_refCount;
    *piVar1 = *piVar1 + 1;
    pTVar2[unitNdx].tex2DArrayBinding = texture;
  }
  return;
}

Assistant:

void ReferenceContext::setTex2DArrayBinding (int unitNdx, Texture2DArray* texture)
{
	if (m_textureUnits[unitNdx].tex2DArrayBinding)
	{
		m_textures.releaseReference(m_textureUnits[unitNdx].tex2DArrayBinding);
		m_textureUnits[unitNdx].tex2DArrayBinding = DE_NULL;
	}

	if (texture)
	{
		m_textures.acquireReference(texture);
		m_textureUnits[unitNdx].tex2DArrayBinding = texture;
	}
}